

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *node)

{
  bool bVar1;
  bool ret;
  ImGuiDockNode *node_local;
  
  if ((node->TabBar == (ImGuiTabBar *)0x0) || (node->HostWindow == (ImGuiWindow *)0x0)) {
    node_local._7_1_ = false;
  }
  else if ((node->MergedFlags & 1U) == 0) {
    Begin(node->HostWindow->Name,(bool *)0x0,0);
    PushOverrideID(node->ID);
    bVar1 = BeginTabBarEx(node->TabBar,&node->TabBar->BarRect,node->TabBar->Flags,node);
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x3b58,"bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *)");
    }
    node_local._7_1_ = true;
  }
  else {
    node_local._7_1_ = false;
  }
  return node_local._7_1_;
}

Assistant:

bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode* node)
{
    if (node->TabBar == NULL || node->HostWindow == NULL)
        return false;
    if (node->MergedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return false;
    Begin(node->HostWindow->Name);
    PushOverrideID(node->ID);
    bool ret = BeginTabBarEx(node->TabBar, node->TabBar->BarRect, node->TabBar->Flags, node);
    IM_UNUSED(ret);
    IM_ASSERT(ret);
    return true;
}